

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

_Bool upb_strtable_next2(upb_strtable *t,upb_StringView *key,upb_value *val,intptr_t *iter)

{
  byte bVar1;
  uint uVar2;
  upb_tabent *puVar3;
  uint *puVar4;
  size_t sVar5;
  bool bVar6;
  
  sVar5 = next(&t->t,*iter);
  bVar1 = (t->t).size_lg2;
  bVar6 = sVar5 < (ulong)(long)(1 << (bVar1 & 0x1f));
  if (bVar6 && bVar1 != 0) {
    puVar3 = (t->t).entries;
    puVar4 = (uint *)puVar3[sVar5].key;
    uVar2 = *puVar4;
    key->data = (char *)(puVar4 + 1);
    key->size = (ulong)uVar2;
    val->val = puVar3[sVar5].val.val;
    *iter = sVar5;
  }
  return bVar6 && bVar1 != 0;
}

Assistant:

bool upb_strtable_next2(const upb_strtable* t, upb_StringView* key,
                        upb_value* val, intptr_t* iter) {
  size_t tab_idx = next(&t->t, *iter);
  if (tab_idx < upb_table_size(&t->t)) {
    upb_tabent* ent = &t->t.entries[tab_idx];
    uint32_t len;
    key->data = upb_tabstr(ent->key, &len);
    key->size = len;
    *val = _upb_value_val(ent->val.val);
    *iter = tab_idx;
    return true;
  }

  return false;
}